

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcbormap.cpp
# Opt level: O1

QDebug operator<<(QDebug dbg,QCborMap *m)

{
  QList<QtCbor::Element> *pQVar1;
  QCborContainerPrivate *pQVar2;
  QCborContainerPrivate *pQVar3;
  DataPointer *pDVar4;
  undefined8 this;
  storage_type *in_RCX;
  undefined8 *in_RDX;
  char *pcVar5;
  ulong uVar6;
  QString *this_00;
  ulong idx;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QDebugStateSaver saver;
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  QDebugStateSaver local_70;
  QCborValue local_68;
  QCborValue local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_70.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_70,(QDebug *)m);
  pQVar2 = (m->d).d.ptr;
  *(undefined1 *)&(pQVar2->elements).d.ptr = 0;
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"QCborMap{";
  QString::fromUtf8((QString *)&local_50,(QString *)0x9,ba);
  QTextStream::operator<<((QTextStream *)pQVar2,(QString *)&local_50);
  if ((QArrayData *)local_50.n != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_50.n,2,0x10);
    }
  }
  pQVar2 = (m->d).d.ptr;
  if (*(char *)&(pQVar2->elements).d.ptr == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar2,' ');
  }
  pQVar2 = (QCborContainerPrivate *)*in_RDX;
  if (pQVar2 == (QCborContainerPrivate *)0x0) {
    uVar6 = 1;
  }
  else {
    uVar6 = (pQVar2->elements).d.size | 1;
  }
  if (uVar6 != 1) {
    idx = 1;
    pcVar5 = "{";
    do {
      pQVar3 = (m->d).d.ptr;
      this_00 = (QString *)0xffffffffffffffff;
      do {
        pDVar4 = &this_00->d;
        this_00 = (QString *)((long)&(this_00->d).d + 1);
      } while ((pcVar5 + 1)[(long)&pDVar4->d] != '\0');
      ba_00.m_data = in_RCX;
      ba_00.m_size = (qsizetype)pcVar5;
      QString::fromUtf8((QString *)&local_50,this_00,ba_00);
      QTextStream::operator<<((QTextStream *)pQVar3,(QString *)&local_50);
      if ((QArrayData *)local_50.n != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_50.n,2,0x10);
        }
      }
      pQVar3 = (m->d).d.ptr;
      if (*(char *)&(pQVar3->elements).d.ptr == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar3,' ');
      }
      local_90._0_8_ = (m->d).d.ptr;
      *(int *)&(((QList<QtCbor::Element> *)&((Stream *)local_90._0_8_)->ref)->d).d =
           *(int *)&(((QList<QtCbor::Element> *)&((Stream *)local_90._0_8_)->ref)->d).d + 1;
      QCborContainerPrivate::valueAt(&local_68,pQVar2,idx - 1);
      operator<<((Stream *)(local_90 + 8),(QCborValue *)local_90);
      this = local_90._8_8_;
      ba_01.m_data = in_RCX;
      ba_01.m_size = (qsizetype)", ";
      QString::fromUtf8((QString *)&local_50,(QString *)0x2,ba_01);
      QTextStream::operator<<((QTextStream *)this,(QString *)&local_50);
      if ((QArrayData *)local_50.n != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_50.n,2,0x10);
        }
      }
      if (*(char *)(local_90._8_8_ + 0x30) == '\x01') {
        QTextStream::operator<<((QTextStream *)local_90._8_8_,' ');
      }
      local_80._0_8_ = local_90._8_8_;
      *(int *)&(((QList<QtCbor::Element> *)(local_90._8_8_ + 0x28))->d).d =
           *(int *)&(((QList<QtCbor::Element> *)(local_90._8_8_ + 0x28))->d).d + 1;
      QCborContainerPrivate::valueAt(&local_50,pQVar2,idx);
      operator<<((Stream *)(local_80 + 8),(QCborValue *)local_80);
      QTextStream::operator<<((QTextStream *)local_80._8_8_,'}');
      if (*(char *)&(((QList<QtCbor::Element> *)(local_80._8_8_ + 0x28))->d).ptr == '\x01') {
        QTextStream::operator<<((QTextStream *)local_80._8_8_,' ');
      }
      QDebug::~QDebug((QDebug *)(local_80 + 8));
      if (local_50.container != (QCborContainerPrivate *)0x0) {
        QCborContainerPrivate::deref(local_50.container);
      }
      QDebug::~QDebug((QDebug *)local_80);
      QDebug::~QDebug((QDebug *)(local_90 + 8));
      if (local_68.container != (QCborContainerPrivate *)0x0) {
        QCborContainerPrivate::deref(local_68.container);
      }
      QDebug::~QDebug((QDebug *)local_90);
      idx = idx + 2;
      pcVar5 = ", {";
    } while (idx != uVar6);
  }
  QTextStream::operator<<((QTextStream *)(m->d).d.ptr,'}');
  pQVar2 = (m->d).d.ptr;
  if (*(char *)&(pQVar2->elements).d.ptr == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar2,' ');
  }
  pQVar2 = (m->d).d.ptr;
  ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)pQVar2;
  pQVar1 = &pQVar2->elements;
  *(int *)&(pQVar1->d).d = *(int *)&(pQVar1->d).d + 1;
  QDebugStateSaver::~QDebugStateSaver(&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QCborMap &m)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QCborMap{";
    const char *open = "{";
    for (auto pair : m) {
        dbg << open << pair.first <<  ", " << pair.second << '}';
        open = ", {";
    }
    return dbg << '}';
}